

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 esc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  u8 uVar4;
  u8 *puVar5;
  u32 uVar6;
  int iVar7;
  u32 uVar8;
  u8 *puVar9;
  bool bVar10;
  bool bVar11;
  uint local_48;
  u32 prior_c;
  int prevEscape;
  u8 noCase;
  u8 matchSet;
  u8 matchAll;
  u8 matchOne;
  int seen;
  int invert;
  u32 c2;
  u32 c;
  u32 esc_local;
  compareInfo *pInfo_local;
  u8 *zString_local;
  u8 *zPattern_local;
  
  bVar1 = pInfo->matchOne;
  bVar2 = pInfo->matchAll;
  bVar3 = pInfo->matchSet;
  uVar4 = pInfo->noCase;
  bVar10 = false;
  pInfo_local = (compareInfo *)zString;
  zString_local = zPattern;
  do {
    while( true ) {
      while( true ) {
        invert = sqlite3Utf8Read(&zString_local);
        if (invert == 0) {
          return (uint)(pInfo_local->matchAll == '\0');
        }
        if ((invert == (uint)bVar2) && (!bVar10)) {
          do {
            invert = sqlite3Utf8Read(&zString_local);
            if (invert != (uint)bVar2 && invert != (uint)bVar1) {
              if (invert == 0) {
                return 1;
              }
              if (invert == esc) {
                invert = sqlite3Utf8Read(&zString_local);
                if (invert == 0) {
                  return 0;
                }
              }
              else if (invert == (uint)bVar3) {
                while( true ) {
                  bVar10 = false;
                  if (pInfo_local->matchAll != '\0') {
                    iVar7 = patternCompare(zString_local + -1,&pInfo_local->matchAll,pInfo,esc);
                    bVar10 = iVar7 == 0;
                  }
                  if (!bVar10) break;
                  puVar9 = &pInfo_local->matchOne;
                  puVar5 = &pInfo_local->matchAll;
                  pInfo_local = (compareInfo *)puVar9;
                  if (0xbf < *puVar5) {
                    for (; (pInfo_local->matchAll & 0xc0) == 0x80;
                        pInfo_local = (compareInfo *)&pInfo_local->matchOne) {
                    }
                  }
                }
                return (uint)(pInfo_local->matchAll != '\0');
              }
              while( true ) {
                seen = sqlite3Utf8Read((uchar **)&pInfo_local);
                if (seen == 0) {
                  return 0;
                }
                if (uVar4 == '\0') {
                  while (seen != 0 && seen != invert) {
                    seen = sqlite3Utf8Read((uchar **)&pInfo_local);
                  }
                }
                else {
                  if ((seen & 0xffffff80U) == 0) {
                    seen = (int)""[(uint)seen];
                  }
                  if ((invert & 0xffffff80U) == 0) {
                    invert = (int)""[(uint)invert];
                  }
                  while (seen != 0 && seen != invert) {
                    seen = sqlite3Utf8Read((uchar **)&pInfo_local);
                    if ((seen & 0xffffff80U) == 0) {
                      seen = (int)""[(uint)seen];
                    }
                  }
                }
                if (seen == 0) break;
                iVar7 = patternCompare(zString_local,&pInfo_local->matchAll,pInfo,esc);
                if (iVar7 != 0) {
                  return 1;
                }
              }
              return 0;
            }
          } while ((invert != (uint)bVar1) ||
                  (uVar6 = sqlite3Utf8Read((uchar **)&pInfo_local), uVar6 != 0));
          return 0;
        }
        if ((invert != (uint)bVar1) || (bVar10)) break;
        uVar6 = sqlite3Utf8Read((uchar **)&pInfo_local);
        if (uVar6 == 0) {
          return 0;
        }
      }
      if (invert == (uint)bVar3) break;
      if ((esc != invert) || (bVar10)) {
        seen = sqlite3Utf8Read((uchar **)&pInfo_local);
        if (uVar4 != '\0') {
          if ((invert & 0xffffff80U) == 0) {
            invert = (int)""[(uint)invert];
          }
          if ((seen & 0xffffff80U) == 0) {
            seen = (int)""[(uint)seen];
          }
        }
        if (invert != seen) {
          return 0;
        }
        bVar10 = false;
      }
      else {
        bVar10 = true;
      }
    }
    local_48 = 0;
    prevEscape = 0;
    uVar6 = sqlite3Utf8Read((uchar **)&pInfo_local);
    if (uVar6 == 0) {
      return 0;
    }
    seen = sqlite3Utf8Read(&zString_local);
    bVar11 = seen == 0x5e;
    if (bVar11) {
      seen = sqlite3Utf8Read(&zString_local);
    }
    _noCase = (uint)bVar11;
    if (seen == 0x5d) {
      prevEscape = (int)(uVar6 == 0x5d);
      seen = sqlite3Utf8Read(&zString_local);
    }
    while (seen != 0 && seen != 0x5d) {
      if ((((seen == 0x2d) && (*zString_local != ']')) && (*zString_local != '\0')) &&
         (local_48 != 0)) {
        uVar8 = sqlite3Utf8Read(&zString_local);
        if ((local_48 <= uVar6) && (uVar6 <= uVar8)) {
          prevEscape = 1;
        }
        local_48 = 0;
      }
      else {
        if (uVar6 == seen) {
          prevEscape = 1;
        }
        local_48 = seen;
      }
      seen = sqlite3Utf8Read(&zString_local);
    }
  } while ((seen != 0) && (prevEscape != _noCase));
  return 0;
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 esc                          /* The escape character */
){
  u32 c, c2;
  int invert;
  int seen;
  u8 matchOne = pInfo->matchOne;
  u8 matchAll = pInfo->matchAll;
  u8 matchSet = pInfo->matchSet;
  u8 noCase = pInfo->noCase; 
  int prevEscape = 0;     /* True if the previous character was 'escape' */

  while( (c = sqlite3Utf8Read(&zPattern))!=0 ){
    if( c==matchAll && !prevEscape ){
      while( (c=sqlite3Utf8Read(&zPattern)) == matchAll
               || c == matchOne ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return 0;
        }
      }
      if( c==0 ){
        return 1;
      }else if( c==esc ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ){
          return 0;
        }
      }else if( c==matchSet ){
        assert( esc==0 );         /* This is GLOB, not LIKE */
        assert( matchSet<0x80 );  /* '[' is a single-byte character */
        while( *zString && patternCompare(&zPattern[-1],zString,pInfo,esc)==0 ){
          SQLITE_SKIP_UTF8(zString);
        }
        return *zString!=0;
      }
      while( (c2 = sqlite3Utf8Read(&zString))!=0 ){
        if( noCase ){
          GlogUpperToLower(c2);
          GlogUpperToLower(c);
          while( c2 != 0 && c2 != c ){
            c2 = sqlite3Utf8Read(&zString);
            GlogUpperToLower(c2);
          }
        }else{
          while( c2 != 0 && c2 != c ){
            c2 = sqlite3Utf8Read(&zString);
          }
        }
        if( c2==0 ) return 0;
        if( patternCompare(zPattern,zString,pInfo,esc) ) return 1;
      }
      return 0;
    }else if( c==matchOne && !prevEscape ){
      if( sqlite3Utf8Read(&zString)==0 ){
        return 0;
      }
    }else if( c==matchSet ){
      u32 prior_c = 0;
      assert( esc==0 );    /* This only occurs for GLOB, not LIKE */
      seen = 0;
      invert = 0;
      c = sqlite3Utf8Read(&zString);
      if( c==0 ) return 0;
      c2 = sqlite3Utf8Read(&zPattern);
      if( c2=='^' ){
        invert = 1;
        c2 = sqlite3Utf8Read(&zPattern);
      }
      if( c2==']' ){
        if( c==']' ) seen = 1;
        c2 = sqlite3Utf8Read(&zPattern);
      }
      while( c2 && c2!=']' ){
        if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
          c2 = sqlite3Utf8Read(&zPattern);
          if( c>=prior_c && c<=c2 ) seen = 1;
          prior_c = 0;
        }else{
          if( c==c2 ){
            seen = 1;
          }
          prior_c = c2;
        }
        c2 = sqlite3Utf8Read(&zPattern);
      }
      if( c2==0 || (seen ^ invert)==0 ){
        return 0;
      }
    }else if( esc==c && !prevEscape ){
      prevEscape = 1;
    }else{
      c2 = sqlite3Utf8Read(&zString);
      if( noCase ){
        GlogUpperToLower(c);
        GlogUpperToLower(c2);
      }
      if( c!=c2 ){
        return 0;
      }
      prevEscape = 0;
    }
  }
  return *zString==0;
}